

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  unsigned_short *puVar6;
  int *piVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uchar *puVar14;
  uivector *puVar15;
  uint *puVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uivector *puVar20;
  uint *puVar21;
  uchar *puVar22;
  uint uVar23;
  uchar *puVar24;
  uint uVar25;
  uchar *puVar26;
  size_t sVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  uint *puVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  uivector *puVar36;
  bool bVar37;
  uint local_c4;
  ulong local_a8;
  ulong local_68;
  
  uVar10 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar10 = windowsize;
  }
  uVar17 = 0x40;
  if (0x1fff < windowsize) {
    uVar17 = 0x102;
  }
  local_c4 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar11 = windowsize - 1;
    local_c4 = 0x5a;
    if ((windowsize & uVar11) == 0) {
      uVar23 = 0x102;
      if (nicematch < 0x102) {
        uVar23 = nicematch;
      }
      local_c4 = 0;
      if (inpos < insize) {
        puVar14 = in + insize;
        local_68 = 0;
        uVar8 = 0;
        bVar9 = false;
        uVar25 = 0;
        local_c4 = 0;
        do {
          uVar12 = getHash(in,insize,inpos);
          uVar32 = 0;
          if (uVar12 == 0) {
            if (uVar25 == 0) {
              puVar24 = in + inpos + 0x102;
              if (puVar14 < in + inpos + 0x102) {
                puVar24 = puVar14;
              }
              for (puVar22 = in + inpos; (puVar22 != puVar24 && (*puVar22 == '\0'));
                  puVar22 = puVar22 + 1) {
              }
              uVar32 = (ulong)(uint)((int)puVar22 - (int)(in + inpos));
            }
            else {
              if ((insize < uVar25 + inpos) || (in[(uVar25 + inpos) - 1] != '\0')) {
                uVar25 = uVar25 - 1;
              }
              uVar32 = (ulong)uVar25;
            }
          }
          uVar25 = (uint)uVar32;
          uVar29 = (uint)inpos & uVar11;
          uVar28 = (ulong)uVar29;
          piVar4 = hash->val;
          piVar4[uVar28] = uVar12;
          piVar5 = hash->head;
          if (piVar5[uVar12] != -1) {
            hash->chain[uVar28] = (unsigned_short)piVar5[uVar12];
          }
          piVar5[uVar12] = uVar29;
          puVar6 = hash->zeros;
          puVar6[uVar28] = (unsigned_short)uVar32;
          piVar7 = hash->headz;
          if (piVar7[uVar32 & 0xffff] != -1) {
            hash->chainz[uVar28] = (unsigned_short)piVar7[uVar32 & 0xffff];
          }
          uVar30 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar30 = insize;
          }
          piVar7[uVar32 & 0xffff] = uVar29;
          if (uVar10 == 0) {
            local_a8 = 0;
            uVar29 = 0;
          }
          else {
            puVar24 = in + inpos;
            uVar29 = 0;
            local_a8 = 0;
            uVar18 = 0;
            uVar34 = (ulong)hash->chain[uVar28];
            uVar13 = 1;
            do {
              uVar19 = 0;
              if (uVar28 < uVar34) {
                uVar19 = (ulong)windowsize;
              }
              uVar19 = (uVar28 - uVar34) + uVar19;
              if ((uint)uVar19 < (uint)uVar18) break;
              if (uVar19 != 0) {
                puVar26 = in + (inpos - (uVar19 & 0xffffffff));
                puVar22 = puVar24;
                if (2 < uVar25) {
                  uVar18 = (ulong)(uint)puVar6[uVar34];
                  if (uVar25 < puVar6[uVar34]) {
                    uVar18 = uVar32;
                  }
                  puVar26 = puVar26 + uVar18;
                  puVar22 = puVar24 + uVar18;
                }
                for (; (puVar22 != in + uVar30 && (*puVar26 == *puVar22)); puVar26 = puVar26 + 1) {
                  puVar22 = puVar22 + 1;
                }
                uVar33 = (int)puVar22 - (int)puVar24;
                if ((uVar29 < uVar33) &&
                   (local_a8 = uVar19 & 0xffffffff, uVar29 = uVar33, uVar23 <= uVar33)) {
                  local_a8 = uVar19 & 0xffffffff;
                  break;
                }
              }
              uVar2 = hash->chain[uVar34];
              uVar35 = (ulong)uVar2;
              if ((ushort)uVar34 == uVar2) break;
              if ((uVar25 < 3) || (uVar29 <= uVar25)) {
                if (piVar4[uVar2] != uVar12) break;
              }
              else {
                uVar35 = (ulong)hash->chainz[uVar34];
                if (uVar25 != puVar6[uVar35]) break;
              }
              bVar37 = uVar13 != uVar10;
              uVar18 = uVar19;
              uVar34 = uVar35;
              uVar13 = uVar13 + 1;
            } while (bVar37);
          }
          if (lazymatching == 0) goto LAB_001ae698;
          if (((!bVar9) && (2 < uVar29)) && (uVar29 <= uVar17 && uVar29 < 0x102)) {
            bVar37 = true;
            bVar9 = true;
            local_68 = local_a8;
            uVar8 = uVar29;
            goto LAB_001aea3c;
          }
          if (!bVar9) {
            bVar9 = false;
            goto LAB_001ae698;
          }
          if (inpos == 0) {
            bVar9 = false;
            local_c4 = 0x51;
            inpos = 0;
LAB_001aea3a:
            bVar37 = false;
          }
          else {
            if (uVar8 + 1 < uVar29) {
              bVar1 = in[inpos - 1];
              uVar12 = uivector_resize(out,out->size + 1);
              if (uVar12 != 0) {
                out->data[out->size - 1] = (uint)bVar1;
                bVar9 = false;
                goto LAB_001ae698;
              }
              bVar9 = false;
LAB_001aea32:
              local_c4 = 0x53;
              goto LAB_001aea3a;
            }
            piVar5[uVar12] = -1;
            piVar7[uVar32] = -1;
            inpos = inpos - 1;
            bVar9 = false;
            local_a8._0_4_ = (uint)local_68;
            uVar29 = uVar8;
LAB_001ae698:
            puVar31 = LENGTHBASE;
            if ((uVar29 < 3) || ((uint)local_a8 <= windowsize)) {
              if (((uVar29 < 3) || (uVar29 < minmatch)) ||
                 ((uVar29 == 3 && (0x1000 < (uint)local_a8)))) {
                bVar1 = in[inpos];
                uVar12 = uivector_resize(out,out->size + 1);
                if (uVar12 == 0) goto LAB_001aea32;
                out->data[out->size - 1] = (uint)bVar1;
                bVar37 = true;
              }
              else {
                puVar15 = (uivector *)0x1;
                puVar20 = (uivector *)0x1c;
                puVar36 = out;
                do {
                  if (puVar20 < puVar15) {
                    puVar36 = (uivector *)0x1c;
                    break;
                  }
                  uVar28 = (ulong)((long)&puVar15->data + (long)&puVar20->data) >> 1;
                  if (uVar29 < LENGTHBASE[uVar28]) {
                    if (uVar29 < *(uint *)(&UNK_00238b9c + uVar28 * 4)) {
                      bVar37 = true;
                      puVar20 = (uivector *)(uVar28 - 1);
                    }
                    else {
                      bVar37 = false;
                      puVar36 = (uivector *)(uVar28 - 1);
                    }
                  }
                  else {
                    puVar15 = (uivector *)(uVar28 + 1);
                    bVar37 = true;
                  }
                } while (bVar37);
                uVar25 = LENGTHBASE[(ulong)puVar36 & 0xffffffff];
                puVar16 = (uint *)0x1;
                puVar21 = (uint *)0x1d;
                do {
                  if (puVar21 < puVar16) {
                    puVar31 = (uint *)0x1d;
                    break;
                  }
                  uVar28 = (ulong)((long)puVar21 + (long)puVar16) >> 1;
                  if ((uint)local_a8 < DISTANCEBASE[uVar28]) {
                    if ((uint)local_a8 < *(uint *)(&UNK_00238c9c + uVar28 * 4)) {
                      bVar37 = true;
                      puVar21 = (uint *)(uVar28 - 1);
                    }
                    else {
                      bVar37 = false;
                      puVar31 = (uint *)(uVar28 - 1);
                    }
                  }
                  else {
                    puVar16 = (uint *)(uVar28 + 1);
                    bVar37 = true;
                  }
                } while (bVar37);
                uVar12 = DISTANCEBASE[(ulong)puVar31 & 0xffffffff];
                uVar13 = uivector_resize(out,out->size + 1);
                if (uVar13 != 0) {
                  out->data[out->size - 1] = (int)puVar36 + 0x101;
                }
                uVar13 = uivector_resize(out,out->size + 1);
                if (uVar13 != 0) {
                  out->data[out->size - 1] = uVar29 - uVar25;
                }
                uVar25 = uivector_resize(out,out->size + 1);
                if (uVar25 != 0) {
                  out->data[out->size - 1] = (uint)puVar31;
                }
                uVar25 = uivector_resize(out,out->size + 1);
                if (uVar25 != 0) {
                  out->data[out->size - 1] = (uint)local_a8 - uVar12;
                }
                piVar4 = hash->head;
                piVar5 = hash->val;
                puVar6 = hash->zeros;
                piVar7 = hash->headz;
                if (uVar29 < 3) {
                  uVar29 = 2;
                }
                uVar12 = 1;
                sVar27 = inpos;
                do {
                  inpos = sVar27 + 1;
                  uVar13 = getHash(in,insize,inpos);
                  uVar28 = 0;
                  if (uVar13 == 0) {
                    if ((int)uVar32 == 0) {
                      puVar24 = in + sVar27 + 0x103;
                      if (puVar14 < in + sVar27 + 0x103) {
                        puVar24 = puVar14;
                      }
                      for (puVar22 = in + inpos; (puVar22 != puVar24 && (*puVar22 == '\0'));
                          puVar22 = puVar22 + 1) {
                      }
                      uVar28 = (ulong)(uint)((int)puVar22 - (int)(in + inpos));
                    }
                    else if ((insize < uVar32 + inpos) ||
                            (uVar28 = uVar32, in[uVar32 + sVar27] != '\0')) {
                      uVar28 = (ulong)((int)uVar32 - 1);
                    }
                  }
                  uVar25 = (uint)uVar28;
                  uVar33 = (uint)inpos & uVar11;
                  piVar5[uVar33] = uVar13;
                  iVar3 = piVar4[uVar13];
                  if (iVar3 != -1) {
                    hash->chain[uVar33] = (unsigned_short)iVar3;
                  }
                  piVar4[uVar13] = uVar33;
                  puVar6[uVar33] = (unsigned_short)uVar28;
                  iVar3 = piVar7[uVar28 & 0xffff];
                  if (iVar3 != -1) {
                    hash->chainz[uVar33] = (unsigned_short)iVar3;
                  }
                  piVar7[uVar28 & 0xffff] = uVar33;
                  uVar12 = uVar12 + 1;
                  sVar27 = inpos;
                  uVar32 = uVar28;
                } while (uVar12 != uVar29);
                bVar37 = true;
              }
            }
            else {
              bVar37 = false;
              local_c4 = 0x56;
            }
          }
LAB_001aea3c:
        } while ((bVar37) && (inpos = inpos + 1, inpos < insize));
      }
    }
  }
  return local_c4;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}